

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitInterpolationExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,InterpolationExpr *expr)

{
  StringExpr *pSVar1;
  Expr *pEVar2;
  undefined1 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  puVar3 = &this->field_0x8;
  pSVar1 = (expr->start)._M_t.
           super___uniq_ptr_impl<enact::StringExpr,_std::default_delete<enact::StringExpr>_>._M_t.
           super__Tuple_impl<0UL,_enact::StringExpr_*,_std::default_delete<enact::StringExpr>_>.
           super__Head_base<0UL,_enact::StringExpr_*,_false>._M_head_impl;
  (*(pSVar1->super_Expr)._vptr_Expr[2])(&local_40,pSVar1,puVar3);
  std::operator+(&local_a0,&local_40,"\\(");
  pEVar2 = (expr->interpolated)._M_t.
           super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
           super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar2->_vptr_Expr[2])(&local_c0,pEVar2,puVar3);
  std::operator+(&local_80,&local_a0,&local_c0);
  std::operator+(&local_60,&local_80,")");
  pEVar2 = (expr->end)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar2->_vptr_Expr[2])(&local_e0,pEVar2,puVar3);
  std::operator+(__return_storage_ptr__,&local_60,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitInterpolationExpr(InterpolationExpr &expr) {
        return visitExpr(*expr.start) + "\\(" + visitExpr(*expr.interpolated) + ")" + visitExpr(*expr.end);
    }